

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O1

void mp::
     WriteFlatCon<fmt::BasicMemoryWriter<char,std::allocator<char>>,mp::CustomFunctionalConstraint<std::array<int,2ul>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::EquivalenceId>>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,
               CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::EquivalenceId>
               *c,ItemNamer *vnam)

{
  Buffer<char> *pBVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  ptrdiff_t _Num;
  ulong uVar5;
  char *str;
  
  pcVar4 = *(char **)c;
  sVar3 = strlen(pcVar4);
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  uVar5 = pBVar1->size_ + sVar3;
  if (pBVar1->capacity_ < uVar5) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar5);
  }
  if (sVar3 != 0) {
    memmove(pBVar1->ptr_ + pBVar1->size_,pcVar4,sVar3);
  }
  pBVar1->size_ = uVar5;
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  uVar5 = pBVar1->size_ + 2;
  if (pBVar1->capacity_ < uVar5) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar5);
  }
  pcVar4 = pBVar1->ptr_;
  sVar2 = pBVar1->size_;
  (pcVar4 + sVar2)[0] = ':';
  (pcVar4 + sVar2)[1] = ' ';
  pBVar1->size_ = uVar5;
  if (-1 < (long)*(int *)(c + 0x20)) {
    pcVar4 = ItemNamer::at(vnam,(long)*(int *)(c + 0x20));
    sVar3 = strlen(pcVar4);
    pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
    uVar5 = pBVar1->size_ + sVar3;
    if (pBVar1->capacity_ < uVar5) {
      (**pBVar1->_vptr_Buffer)(pBVar1,uVar5);
    }
    if (sVar3 != 0) {
      memmove(pBVar1->ptr_ + pBVar1->size_,pcVar4,sVar3);
    }
    pBVar1->size_ = uVar5;
    pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
    uVar5 = pBVar1->size_ + 4;
    if (pBVar1->capacity_ < uVar5) {
      (**pBVar1->_vptr_Buffer)(pBVar1,uVar5);
    }
    builtin_strncpy(pBVar1->ptr_ + pBVar1->size_," == ",4);
    pBVar1->size_ = uVar5;
  }
  WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::array<int,2ul>,std::array<int,0ul>,mp::EquivalenceId>
            (wrt,(CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::EquivalenceId>
                  *)(c + 0x28),vnam);
  return;
}

Assistant:

inline void WriteFlatCon(Writer& wrt, const Con& c,
                  ItemNamer& vnam) {
  wrt << c.name() << ": ";
  WriteModelItem(wrt, c, vnam);
}